

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void update_smooth_effects_playing(IT_PLAYING *playing)

{
  int iVar1;
  
  playing->vibrato_time =
       playing->vibrato_time + playing->vibrato_n * playing->vibrato_speed * '\x04';
  playing->tremolo_time = playing->tremolo_time + playing->tremolo_speed * '\x04';
  playing->panbrello_time = playing->panbrello_time + playing->panbrello_speed;
  if (playing->panbrello_waveform == '\x03') {
    iVar1 = rand();
    playing->panbrello_random =
         (char)iVar1 +
         ((char)(uint)((ulong)((long)iVar1 * 0xfe03f81) >> 0x23) - (char)(iVar1 >> 0x1f)) * '\x7f' +
         -0x40;
  }
  return;
}

Assistant:

static void update_smooth_effects_playing(IT_PLAYING *playing)
{
	playing->vibrato_time += playing->vibrato_n *
		(playing->vibrato_speed << 2);
	playing->tremolo_time += playing->tremolo_speed << 2;
	playing->panbrello_time += playing->panbrello_speed;
	if (playing->panbrello_waveform == 3)
		playing->panbrello_random = (rand() % 129) - 64;
}